

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall
argparse::Argument::Argument<1ul,0ul>
          (Argument *this,size_t param_2,size_t param_3,
          array<std::basic_string_view<char,_std::char_traits<char>_>,_1UL> *a)

{
  string_view prefix_chars;
  string_view name;
  bool bVar1;
  reference pvVar2;
  iterator iVar3;
  iterator iVar4;
  undefined1 local_33 [3];
  array<std::basic_string_view<char,_std::char_traits<char>_>,_1UL> *local_30;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_1UL> *a_local;
  Argument *this_local;
  size_t sStack_18;
  string_view prefix_chars_local;
  
  local_30 = a;
  a_local = (array<std::basic_string_view<char,_std::char_traits<char>_>,_1UL> *)this;
  sStack_18 = param_2;
  prefix_chars_local._M_len = param_3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_names);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->m_used_name);
  std::__cxx11::string::string((string *)&this->m_help);
  std::__cxx11::string::string((string *)&this->m_metavar);
  std::any::any(&this->m_default_value);
  std::__cxx11::string::string((string *)&this->m_default_value_repr);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->m_default_value_str);
  std::any::any(&this->m_implicit_value);
  std::
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::optional();
  std::
  variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
  ::
  variant<std::function<std::any(std::__cxx11::string_const&)>,argparse::Argument::m_action::_lambda(std::__cxx11::string_const&)_1_,void>
            ((variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
              *)&this->m_action,local_33);
  std::vector<std::any,_std::allocator<std::any>_>::vector(&this->m_values);
  NArgsRange::NArgsRange(&this->m_num_args_range,1,1);
  this->field_0x140 = this->field_0x140 & 0xfe;
  pvVar2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_1UL>::operator[]
                     (local_30,0);
  name._M_len = pvVar2->_M_len;
  name._M_str = pvVar2->_M_str;
  prefix_chars._M_str = (char *)prefix_chars_local._M_len;
  prefix_chars._M_len = sStack_18;
  bVar1 = is_optional(name,prefix_chars);
  this->field_0x140 = this->field_0x140 & 0xfd | bVar1 * '\x02';
  this->field_0x140 = this->field_0x140 & 0xfb;
  this->field_0x140 = this->field_0x140 & 0xf7;
  this->field_0x140 = this->field_0x140 & 0xef;
  (this->m_prefix_chars)._M_len = sStack_18;
  (this->m_prefix_chars)._M_str = (char *)prefix_chars_local._M_len;
  pvVar2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_1UL>::operator[]
                     (local_30,0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,pvVar2);
  iVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(&this->m_names);
  iVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->m_names);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,argparse::Argument::Argument<1ul,0ul>(std::basic_string_view<char,std::char_traits<char>>,std::array<std::basic_string_view<char,std::char_traits<char>>,1ul>&&,std::integer_sequence<unsigned_long,0ul>)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar3._M_current,iVar4._M_current);
  return;
}

Assistant:

explicit Argument(std::string_view prefix_chars,
                    std::array<std::string_view, N> &&a,
                    std::index_sequence<I...> /*unused*/)
      : m_accepts_optional_like_value(false),
        m_is_optional((is_optional(a[I], prefix_chars) || ...)),
        m_is_required(false), m_is_repeatable(false), m_is_used(false),
        m_prefix_chars(prefix_chars) {
    ((void)m_names.emplace_back(a[I]), ...);
    std::sort(
        m_names.begin(), m_names.end(), [](const auto &lhs, const auto &rhs) {
          return lhs.size() == rhs.size() ? lhs < rhs : lhs.size() < rhs.size();
        });
  }